

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysc_node_container_free(lysf_ctx *ctx,lysc_node_container *node)

{
  lysc_node *plVar1;
  lysc_node_action *plVar2;
  lysc_node_notif *plVar3;
  lysc_when **pplVar4;
  lysc_must *plVar5;
  lysc_when *plVar6;
  lysc_ext_instance *plVar7;
  lysc_node *node_00;
  lysc_node_action *node_01;
  lysc_node_notif *node_02;
  uint64_t c__;
  lysc_when *plVar8;
  lysc_ext_instance *plVar9;
  long lVar10;
  
  node_00 = node->child;
  while (node_00 != (lysc_node *)0x0) {
    plVar1 = node_00->next;
    lysc_node_free_(ctx,node_00);
    node_00 = plVar1;
  }
  node_01 = node->actions;
  while (node_01 != (lysc_node_action *)0x0) {
    plVar2 = (lysc_node_action *)(node_01->field_0).node.next;
    lysc_node_free_(ctx,(lysc_node *)node_01);
    node_01 = plVar2;
  }
  node_02 = node->notifs;
  while (node_02 != (lysc_node_notif *)0x0) {
    plVar3 = (lysc_node_notif *)(node_02->field_0).node.next;
    lysc_node_free_(ctx,(lysc_node *)node_02);
    node_02 = plVar3;
  }
  lVar10 = 0;
  plVar8 = (lysc_when *)0x0;
  while( true ) {
    pplVar4 = node->when;
    if (pplVar4 == (lysc_when **)0x0) {
      plVar6 = (lysc_when *)0x0;
    }
    else {
      plVar6 = pplVar4[-1];
    }
    if (plVar6 <= plVar8) break;
    lysc_when_free(ctx,(lysc_when **)((long)pplVar4 + lVar10));
    plVar8 = (lysc_when *)((long)&plVar8->cond + 1);
    lVar10 = lVar10 + 8;
  }
  if (pplVar4 != (lysc_when **)0x0) {
    free(pplVar4 + -1);
  }
  lVar10 = 0;
  plVar9 = (lysc_ext_instance *)0x0;
  while( true ) {
    plVar5 = node->musts;
    if (plVar5 == (lysc_must *)0x0) {
      plVar7 = (lysc_ext_instance *)0x0;
    }
    else {
      plVar7 = plVar5[-1].exts;
    }
    if (plVar7 <= plVar9) break;
    lysc_must_free(ctx,(lysc_must *)((long)&plVar5->cond + lVar10));
    plVar9 = (lysc_ext_instance *)((long)&plVar9->def + 1);
    lVar10 = lVar10 + 0x38;
  }
  if (plVar5 == (lysc_must *)0x0) {
    return;
  }
  free(&plVar5[-1].exts);
  return;
}

Assistant:

void
lysc_node_container_free(struct lysf_ctx *ctx, struct lysc_node_container *node)
{
    struct lysc_node *child, *child_next;

    LY_LIST_FOR_SAFE(node->child, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)node->actions, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)node->notifs, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    FREE_ARRAY(ctx, node->when, lysc_when_free);
    FREE_ARRAY(ctx, node->musts, lysc_must_free);
}